

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Impl::Impl_Assertion::CerrFailureHandler::fail
          (CerrFailureHandler *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference this_00;
  string *psVar4;
  Variable *variable;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *__range3;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *variableList_local;
  string *expressionText_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  CerrFailureHandler *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"Assert failed: ");
  poVar3 = std::operator<<(poVar3,(string *)expressionText);
  std::operator<<(poVar3,"\n");
  __end3 = Test::Impl::std::
           vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
           ::begin(variableList);
  variable = (Variable *)
             Test::Impl::std::
             vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
             ::end(variableList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_Enhedron::Assertion::Impl::Configurable::Variable_*,_std::vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>_>
                                *)&variable);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Enhedron::Assertion::Impl::Configurable::Variable_*,_std::vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>_>
              ::operator*(&__end3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
    psVar4 = Assertion::Impl::Configurable::Variable::name_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," = ");
    psVar4 = Assertion::Impl::Configurable::Variable::value_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,": in file ");
    psVar4 = Assertion::Impl::Configurable::Variable::file_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,", line ");
    iVar2 = Assertion::Impl::Configurable::Variable::line(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::
    __normal_iterator<const_Enhedron::Assertion::Impl::Configurable::Variable_*,_std::vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>_>
    ::operator++(&__end3);
  }
  std::ostream::flush();
  std::terminate();
}

Assistant:

virtual void fail(optional<string> description, const string &expressionText, const vector <Variable> &variableList) override {
            cerr << "Assert failed: " << expressionText << "\n";

            for (const auto &variable : variableList) {
                cerr << "    " << variable.name() << " = " << variable.value() <<
                ": in file " << variable.file() << ", line " << variable.line() << "\n";
            }

            cerr.flush();

            #ifndef NDEBUG
                terminate();
            #endif
        }